

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O0

LPBYTE CaptureByteArray(LPBYTE pbDataPtr,LPBYTE pbDataEnd,size_t nLength,LPBYTE pbOutput)

{
  LPBYTE pbOutput_local;
  size_t nLength_local;
  LPBYTE pbDataEnd_local;
  LPBYTE pbDataPtr_local;
  
  if (pbDataEnd < pbDataPtr + nLength) {
    pbDataPtr_local = (LPBYTE)0x0;
  }
  else {
    memcpy(pbOutput,pbDataPtr,nLength);
    pbDataPtr_local = pbDataPtr + nLength;
  }
  return pbDataPtr_local;
}

Assistant:

LPBYTE CaptureByteArray(LPBYTE pbDataPtr, LPBYTE pbDataEnd, size_t nLength, LPBYTE pbOutput)
{
    // Is there enough data?
    if((pbDataPtr + nLength) > pbDataEnd)
        return NULL;

    // Give data
    memcpy(pbOutput, pbDataPtr, nLength);

    // Return the pointer to data following after the integer
    return pbDataPtr + nLength;
}